

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Dropout_x86_avx2::forward_inplace(Dropout_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  uint uVar16;
  
  fVar2 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx2[-3]);
  if (fVar2 != 1.0) {
    iVar12 = bottom_top_blob->dims;
    if (bottom_top_blob->elempack == 4) {
      uVar3 = bottom_top_blob->w;
      uVar4 = bottom_top_blob->h;
      uVar16 = bottom_top_blob->c;
      if (iVar12 == 3) {
        if (0 < (int)uVar16) {
          uVar13 = 1;
          if (1 < (int)uVar16) {
            uVar13 = (ulong)uVar16;
          }
          uVar11 = 0;
          do {
            if (0 < (int)(uVar4 * uVar3)) {
              pfVar15 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar12 = uVar4 * uVar3;
              do {
                *pfVar15 = fVar2 * *pfVar15;
                pfVar15[1] = fVar2 * pfVar15[1];
                pfVar15[2] = fVar2 * pfVar15[2];
                pfVar15[3] = fVar2 * pfVar15[3];
                pfVar15 = pfVar15 + 4;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else if (iVar12 == 2) {
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            if (0 < (int)uVar3) {
              pfVar15 = (float *)((long)bottom_top_blob->w * uVar13 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar11 = (ulong)uVar3;
              do {
                *pfVar15 = fVar2 * *pfVar15;
                pfVar15[1] = fVar2 * pfVar15[1];
                pfVar15[2] = fVar2 * pfVar15[2];
                pfVar15[3] = fVar2 * pfVar15[3];
                pfVar15 = pfVar15 + 4;
                uVar16 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar4);
        }
      }
      else if ((iVar12 == 1) && (0 < (int)uVar3)) {
        lVar14 = 0;
        do {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar14);
          fVar5 = pfVar15[1];
          fVar6 = pfVar15[2];
          fVar7 = pfVar15[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar1 = fVar2 * *pfVar15;
          pfVar1[1] = fVar2 * fVar5;
          pfVar1[2] = fVar2 * fVar6;
          pfVar1[3] = fVar2 * fVar7;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar3 << 4 != lVar14);
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar12 = Dropout::forward_inplace
                           ((Dropout *)
                            ((long)&this->_vptr_Dropout_x86_avx2 +
                            (long)this->_vptr_Dropout_x86_avx2[-3]),bottom_top_blob,opt);
        return iVar12;
      }
      uVar3 = bottom_top_blob->w;
      uVar4 = bottom_top_blob->h;
      uVar16 = bottom_top_blob->c;
      if (iVar12 == 3) {
        if (0 < (int)uVar16) {
          uVar13 = 1;
          if (1 < (int)uVar16) {
            uVar13 = (ulong)uVar16;
          }
          uVar11 = 0;
          do {
            if (0 < (int)(uVar4 * uVar3)) {
              pfVar15 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar12 = uVar4 * uVar3;
              do {
                *pfVar15 = fVar2 * *pfVar15;
                pfVar15[1] = fVar2 * pfVar15[1];
                pfVar15[2] = fVar2 * pfVar15[2];
                pfVar15[3] = fVar2 * pfVar15[3];
                pfVar15[4] = fVar2 * pfVar15[4];
                pfVar15[5] = fVar2 * pfVar15[5];
                pfVar15[6] = fVar2 * pfVar15[6];
                pfVar15[7] = 0.0;
                pfVar15 = pfVar15 + 8;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else if (iVar12 == 2) {
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            if (0 < (int)uVar3) {
              pfVar15 = (float *)((long)bottom_top_blob->w * uVar13 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar11 = (ulong)uVar3;
              do {
                *pfVar15 = fVar2 * *pfVar15;
                pfVar15[1] = fVar2 * pfVar15[1];
                pfVar15[2] = fVar2 * pfVar15[2];
                pfVar15[3] = fVar2 * pfVar15[3];
                pfVar15[4] = fVar2 * pfVar15[4];
                pfVar15[5] = fVar2 * pfVar15[5];
                pfVar15[6] = fVar2 * pfVar15[6];
                pfVar15[7] = 0.0;
                pfVar15 = pfVar15 + 8;
                uVar16 = (int)uVar11 - 1;
                uVar11 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar4);
        }
      }
      else if ((iVar12 == 1) && (0 < (int)uVar3)) {
        lVar14 = 0;
        do {
          pfVar15 = (float *)((long)bottom_top_blob->data + lVar14);
          fVar5 = pfVar15[1];
          fVar6 = pfVar15[2];
          fVar7 = pfVar15[3];
          fVar8 = pfVar15[4];
          fVar9 = pfVar15[5];
          fVar10 = pfVar15[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar14);
          *pfVar1 = fVar2 * *pfVar15;
          pfVar1[1] = fVar2 * fVar5;
          pfVar1[2] = fVar2 * fVar6;
          pfVar1[3] = fVar2 * fVar7;
          pfVar1[4] = fVar2 * fVar8;
          pfVar1[5] = fVar2 * fVar9;
          pfVar1[6] = fVar2 * fVar10;
          pfVar1[7] = 0.0;
          lVar14 = lVar14 + 0x20;
        } while ((ulong)uVar3 << 5 != lVar14);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}